

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLoadXYZROTnodeBody::ComputeQ
          (ChLoadXYZROTnodeBody *this,ChState *state_x,ChStateDelta *state_w)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  pointer psVar5;
  element_type *peVar6;
  double *pdVar7;
  double *pdVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [64];
  uint uVar11;
  long lVar12;
  long lVar13;
  Index index;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  _func_int **pp_Var76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  ChVector<double> v;
  ChVector<double> abs_force;
  ChFrameMoving<double> rel_AB;
  ChFrameMoving<double> bodycoordB;
  ChFrameMoving<double> bodycoordA;
  ulong local_4b8;
  ulong local_4b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_498;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_490;
  ulong local_488;
  ulong local_470;
  ChQuaternion<double> local_468;
  undefined1 local_448 [192];
  ChCoordsys<double> CStack_388;
  double local_350;
  double local_348;
  ulong local_340;
  ChFrameMoving<double> local_338;
  ChVector<double> local_238;
  ChFrameMoving<double> local_220;
  ChFrameMoving<double> local_128;
  
  psVar5 = (this->super_ChLoadCustomMultiple).loadables.
           super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = (psVar5->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if (peVar6 == (element_type *)0x0) {
    lVar12 = 0;
  }
  else {
    lVar12 = __dynamic_cast(peVar6,&ChLoadable::typeinfo,&ChNodeFEAxyzrot::typeinfo,
                            0xffffffffffffffff);
  }
  if (lVar12 == 0) {
    local_490 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar12 = 0;
  }
  else {
    local_490 = (psVar5->super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
    if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_490->_M_use_count = local_490->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_490->_M_use_count = local_490->_M_use_count + 1;
      }
    }
  }
  psVar5 = (this->super_ChLoadCustomMultiple).loadables.
           super__Vector_base<std::shared_ptr<chrono::ChLoadable>,_std::allocator<std::shared_ptr<chrono::ChLoadable>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  peVar6 = psVar5[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar6 == (element_type *)0x0) {
    lVar13 = 0;
  }
  else {
    lVar13 = __dynamic_cast(peVar6,&ChLoadable::typeinfo,&ChBody::typeinfo,0xffffffffffffffff);
  }
  if (lVar13 == 0) {
    local_498 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar13 = 0;
  }
  else {
    local_498 = psVar5[1].super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
    if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_498->_M_use_count = local_498->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_498->_M_use_count = local_498->_M_use_count + 1;
      }
    }
  }
  local_338.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_338.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_338.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_220.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_220.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_220.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_220.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_128,(ChVector<double> *)&local_338,(ChQuaternion<double> *)&local_220);
  local_448._16_8_ = 0.0;
  local_448._0_8_ = (_func_int **)0x0;
  local_448._8_8_ = 0.0;
  local_338.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_338.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_338.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  ChFrameMoving<double>::ChFrameMoving
            (&local_220,(ChVector<double> *)local_448,(ChQuaternion<double> *)&local_338);
  if (state_x == (ChState *)0x0) {
    ChFrame<double>::SetCoord
              (&local_128.super_ChFrame<double>,(ChCoordsys<double> *)(lVar12 + 0x20));
    ChFrame<double>::SetCoord
              (&local_220.super_ChFrame<double>,(ChCoordsys<double> *)(lVar13 + 0x80));
  }
  else {
    local_448._0_8_ =
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_448._48_8_ =
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_448._8_8_ = 3.45845952088873e-323;
    local_448._32_8_ = 0.0;
    local_448._24_8_ = state_x;
    if ((long)local_448._48_8_ < 7) goto LAB_006532a1;
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&local_338,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_448,(type *)0x0);
    ChFrame<double>::SetCoord(&local_128.super_ChFrame<double>,(ChCoordsys<double> *)&local_338);
    local_448._48_8_ =
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_448._0_8_ =
         (state_x->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 7;
    local_448._8_8_ = 3.45845952088873e-323;
    local_448._32_8_ = 3.45845952088873e-323;
    local_448._24_8_ = state_x;
    if ((long)local_448._48_8_ < 0xe) goto LAB_006532a1;
    ChCoordsys<double>::ChCoordsys<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChCoordsys<double> *)&local_338,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               local_448,(type *)0x0);
    ChFrame<double>::SetCoord(&local_220.super_ChFrame<double>,(ChCoordsys<double> *)&local_338);
  }
  if (state_w == (ChStateDelta *)0x0) {
    if (&local_128.coord_dt != (ChCoordsys<double> *)(lVar12 + 0xa0)) {
      local_128.coord_dt.pos.m_data[0] = *(double *)(lVar12 + 0xa0);
      local_128.coord_dt.pos.m_data[1] = *(double *)(lVar12 + 0xa8);
      local_128.coord_dt.pos.m_data[2] = *(double *)(lVar12 + 0xb0);
      local_128.coord_dt.rot.m_data[0] = *(double *)(lVar12 + 0xb8);
      local_128.coord_dt.rot.m_data[1] = *(double *)(lVar12 + 0xc0);
      local_128.coord_dt.rot.m_data[2] = *(double *)(lVar12 + 200);
      local_128.coord_dt.rot.m_data[3] = *(double *)(lVar12 + 0xd0);
    }
    if (&local_220.coord_dt != (ChCoordsys<double> *)(lVar13 + 0x100)) {
      local_220.coord_dt.pos.m_data[0] = *(double *)(lVar13 + 0x100);
      local_220.coord_dt.pos.m_data[1] = *(double *)(lVar13 + 0x108);
      local_220.coord_dt.pos.m_data[2] = *(double *)(lVar13 + 0x110);
      local_220.coord_dt.rot.m_data[0] = *(double *)(lVar13 + 0x118);
      local_220.coord_dt.rot.m_data[1] = *(double *)(lVar13 + 0x120);
      local_220.coord_dt.rot.m_data[2] = *(double *)(lVar13 + 0x128);
      local_220.coord_dt.rot.m_data[3] = *(double *)(lVar13 + 0x130);
    }
  }
  else {
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         (state_w->super_ChVectorDynamic<double>).
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 0.0;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 3) goto LAB_006532a1;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_448,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_128.coord_dt.pos.m_data[0] = (double)local_448._0_8_;
    local_128.coord_dt.pos.m_data[1] = (double)local_448._8_8_;
    local_128.coord_dt.pos.m_data[2] = (double)local_448._16_8_;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 3);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 6) goto LAB_006532a1;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_448,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_128,(ChVector<double> *)local_448);
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 6);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 2.96439387504748e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 9) goto LAB_006532a1;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_448,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    local_220.coord_dt.pos.m_data[0] = (double)local_448._0_8_;
    local_220.coord_dt.pos.m_data[1] = (double)local_448._8_8_;
    local_220.coord_dt.pos.m_data[2] = (double)local_448._16_8_;
    local_338.super_ChFrame<double>.coord.rot.m_data[2] =
         (double)(state_w->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
    local_338.super_ChFrame<double>._vptr_ChFrame =
         (_func_int **)
         ((state_w->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data + 9);
    local_338.super_ChFrame<double>.coord.pos.m_data[0] = 1.48219693752374e-323;
    local_338.super_ChFrame<double>.coord.rot.m_data[0] = 4.44659081257122e-323;
    local_338.super_ChFrame<double>.coord.pos.m_data[2] = (double)state_w;
    if ((long)local_338.super_ChFrame<double>.coord.rot.m_data[2] < 0xc) goto LAB_006532a1;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              ((ChVector<double> *)local_448,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_338,(type *)0x0);
    ChFrameMoving<double>::SetWvel_loc(&local_220,(ChVector<double> *)local_448);
  }
  local_448._8_8_ = (this->loc_application_A).coord.pos.m_data[0];
  local_448._16_8_ = (this->loc_application_A).coord.pos.m_data[1];
  local_448._24_8_ = (this->loc_application_A).coord.pos.m_data[2];
  local_448._32_8_ = (this->loc_application_A).coord.rot.m_data[0];
  local_448._40_8_ = (this->loc_application_A).coord.rot.m_data[1];
  local_448._48_8_ = (this->loc_application_A).coord.rot.m_data[2];
  local_448._56_8_ = (this->loc_application_A).coord.rot.m_data[3];
  local_448._64_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_448._72_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_448._80_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_448._88_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_448._96_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_448._104_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_448._112_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_448._120_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_448._128_8_ =
       (this->loc_application_A).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_448._0_8_ = &PTR__ChFrame_00b2b278;
  local_448._136_8_ = 0.0;
  local_448._144_8_ = 0.0;
  local_448._152_8_ = 0.0;
  local_448._160_8_ = 0.0;
  local_448._168_8_ = 0.0;
  local_448._176_8_ = 0.0;
  CStack_388 = SUB6456(ZEXT464(0),0);
  auVar10._56_8_ = 0;
  auVar10._0_8_ = CStack_388.pos.m_data[0];
  auVar10._8_8_ = CStack_388.pos.m_data[1];
  auVar10._16_8_ = CStack_388.pos.m_data[2];
  auVar10._24_8_ = CStack_388.rot.m_data[0];
  auVar10._32_8_ = CStack_388.rot.m_data[1];
  auVar10._40_8_ = CStack_388.rot.m_data[2];
  auVar10._48_8_ = CStack_388.rot.m_data[3];
  stack0xfffffffffffffc70 = auVar10 << 0x40;
  local_238.m_data[2] = 0.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_468.m_data[0] = 1.0;
  local_468.m_data[1] = 0.0;
  local_468.m_data[2] = 0.0;
  local_468.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_238,&local_468);
  ChFrameMoving<double>::TransformLocalToParent
            (&local_128,(ChFrameMoving<double> *)local_448,&local_338);
  ChFrameMoving<double>::operator=(&this->frame_Aw,&local_338);
  local_448._8_8_ = (this->loc_application_B).coord.pos.m_data[0];
  local_448._16_8_ = (this->loc_application_B).coord.pos.m_data[1];
  local_448._24_8_ = (this->loc_application_B).coord.pos.m_data[2];
  local_448._32_8_ = (this->loc_application_B).coord.rot.m_data[0];
  local_448._40_8_ = (this->loc_application_B).coord.rot.m_data[1];
  local_448._48_8_ = (this->loc_application_B).coord.rot.m_data[2];
  local_448._56_8_ = (this->loc_application_B).coord.rot.m_data[3];
  local_448._64_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_448._72_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_448._80_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_448._88_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_448._96_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_448._104_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_448._112_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_448._120_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_448._128_8_ =
       (this->loc_application_B).Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_448._0_8_ = &PTR__ChFrame_00b2b278;
  local_448._136_8_ = 0.0;
  local_448._144_8_ = 0.0;
  local_448._152_8_ = 0.0;
  local_448._160_8_ = 0.0;
  local_448._168_8_ = 0.0;
  local_448._176_8_ = 0.0;
  CStack_388 = SUB6456(ZEXT464(0),0);
  local_448._184_8_ = 0.0;
  local_238.m_data[2] = 0.0;
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_468.m_data[0] = 1.0;
  local_468.m_data[1] = 0.0;
  local_468.m_data[2] = 0.0;
  local_468.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_238,&local_468);
  ChFrameMoving<double>::TransformLocalToParent
            (&local_220,(ChFrameMoving<double> *)local_448,&local_338);
  ChFrameMoving<double>::operator=(&this->frame_Bw,&local_338);
  local_448._8_8_ = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[0];
  local_448._16_8_ = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[1];
  local_448._24_8_ = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2];
  local_448._32_8_ = (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[0];
  local_448._40_8_ = (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[1];
  local_448._48_8_ = (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[2];
  local_448._56_8_ = (this->frame_Bw).super_ChFrame<double>.coord.rot.m_data[3];
  local_448._64_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_448._72_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_448._80_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_448._88_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_448._96_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_448._104_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_448._112_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_448._120_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_448._128_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_448._0_8_ = &PTR__ChFrame_00b2b278;
  local_448._136_8_ = (this->frame_Bw).coord_dt.pos.m_data[0];
  local_448._144_8_ = (this->frame_Bw).coord_dt.pos.m_data[1];
  local_448._152_8_ = (this->frame_Bw).coord_dt.pos.m_data[2];
  local_448._160_8_ = (this->frame_Bw).coord_dt.rot.m_data[0];
  local_448._168_8_ = (this->frame_Bw).coord_dt.rot.m_data[1];
  local_448._176_8_ = (this->frame_Bw).coord_dt.rot.m_data[2];
  unique0x1000152f = *(undefined1 (*) [64])((this->frame_Bw).coord_dt.rot.m_data + 3);
  ChFrameMoving<double>::Invert((ChFrameMoving<double> *)local_448);
  local_238.m_data[0] = 0.0;
  local_238.m_data[1] = 0.0;
  local_238.m_data[2] = 0.0;
  local_468.m_data[0] = 1.0;
  local_468.m_data[1] = 0.0;
  local_468.m_data[2] = 0.0;
  local_468.m_data[3] = 0.0;
  ChFrameMoving<double>::ChFrameMoving(&local_338,&local_238,&local_468);
  ChFrameMoving<double>::TransformLocalToParent
            ((ChFrameMoving<double> *)local_448,&this->frame_Aw,&local_338);
  (*(this->super_ChLoadCustomMultiple).super_ChLoadBase.super_ChObj._vptr_ChObj[0x16])
            (this,&local_338,&this->locB_force,&this->locB_torque);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  dVar1 = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar24._8_8_ = 0;
  auVar24._0_8_ = (this->locB_force).m_data[0];
  dVar56 = (this->locB_force).m_data[1];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar56;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar1 * dVar56;
  auVar18 = vfmadd231sd_fma(auVar17,auVar35,auVar24);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = (this->locB_force).m_data[2];
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar17 = vfmadd231sd_avx512f(auVar18,auVar28,auVar26);
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  dVar2 = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar2;
  auVar18 = vmulsd_avx512f(auVar25,auVar18);
  auVar18 = vfmadd231sd_avx512f(auVar18,auVar22,auVar24);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar19 = vfmadd231sd_avx512f(auVar18,auVar29,auVar26);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  dVar3 = (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = dVar56 * dVar3;
  auVar18 = vfmadd231sd_fma(auVar27,auVar23,auVar24);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       (this->frame_Bw).super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar18 = vfmadd231sd_fma(auVar18,auVar34,auVar26);
  pp_Var76 = auVar17._0_8_;
  local_448._0_8_ = pp_Var76;
  vmovsd_avx512f(auVar19);
  dVar56 = auVar18._0_8_;
  local_448._16_8_ = dVar56;
  if (2 < (this->super_ChLoadCustomMultiple).load_Q.
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
    auVar70._8_8_ = 0;
    auVar70._0_8_ = (this->locB_torque).m_data[0];
    dVar4 = (this->locB_torque).m_data[1];
    auVar45._8_8_ = 0;
    auVar45._0_8_ = dVar4 * dVar1;
    auVar35 = vfmadd213sd_fma(auVar35,auVar70,auVar45);
    dVar1 = (this->locB_torque).m_data[2];
    auVar94._8_8_ = 0;
    auVar94._0_8_ = dVar1;
    auVar20 = vfmadd213sd_avx512f(auVar28,auVar94,auVar35);
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar4 * dVar2;
    auVar35 = vfmadd213sd_fma(auVar22,auVar70,auVar31);
    auVar21 = vfmadd213sd_avx512f(auVar29,auVar94,auVar35);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = dVar4 * dVar3;
    auVar35 = vfmadd213sd_fma(auVar23,auVar70,auVar32);
    local_128.super_ChFrame<double>.coord.pos.m_data[0] =
         (this->frame_Aw).super_ChFrame<double>.coord.pos.m_data[0] -
         local_128.super_ChFrame<double>.coord.pos.m_data[0];
    local_128.super_ChFrame<double>.coord.pos.m_data[1] =
         (this->frame_Aw).super_ChFrame<double>.coord.pos.m_data[1] -
         local_128.super_ChFrame<double>.coord.pos.m_data[1];
    auVar51._8_8_ = 0;
    auVar51._0_8_ =
         (this->frame_Aw).super_ChFrame<double>.coord.pos.m_data[2] -
         local_128.super_ChFrame<double>.coord.pos.m_data[2];
    auVar22 = vmulsd_avx512f(auVar19,auVar51);
    auVar46._8_8_ = 0;
    auVar46._0_8_ = local_128.super_ChFrame<double>.coord.pos.m_data[1];
    auVar18 = vfnmadd231sd_fma(auVar22,auVar46,auVar18);
    auVar62._8_8_ = 0;
    auVar62._0_8_ = dVar56 * local_128.super_ChFrame<double>.coord.pos.m_data[0];
    auVar17 = vfnmadd231sd_fma(auVar62,auVar17,auVar51);
    auVar47._8_8_ = 0;
    auVar47._0_8_ = local_128.super_ChFrame<double>.coord.rot.m_data[0];
    auVar52._8_8_ = 0;
    auVar52._0_8_ = local_128.super_ChFrame<double>.coord.rot.m_data[1];
    auVar72._8_8_ = 0;
    auVar72._0_8_ = local_128.super_ChFrame<double>.coord.rot.m_data[2];
    auVar82._8_8_ = 0;
    auVar82._0_8_ = local_128.super_ChFrame<double>.coord.rot.m_data[3];
    auVar22 = vmulsd_avx512f(auVar82,auVar82);
    auVar30._8_8_ = 0x8000000000000000;
    auVar30._0_8_ = 0x8000000000000000;
    auVar23 = vxorpd_avx512vl(auVar47,auVar30);
    auVar24 = vmulsd_avx512f(auVar52,auVar23);
    auVar25 = vmulsd_avx512f(auVar52,auVar72);
    auVar26 = vmulsd_avx512f(auVar52,auVar82);
    auVar83._8_8_ = 0;
    auVar83._0_8_ =
         local_128.super_ChFrame<double>.coord.rot.m_data[0] *
         local_128.super_ChFrame<double>.coord.rot.m_data[0] +
         local_128.super_ChFrame<double>.coord.rot.m_data[1] *
         local_128.super_ChFrame<double>.coord.rot.m_data[1];
    auVar27 = vfmadd213sd_avx512f(auVar83,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
    auVar86._8_8_ = 0;
    auVar86._0_8_ = local_128.super_ChFrame<double>.coord.rot.m_data[3] * auVar23._0_8_;
    auVar28 = vsubsd_avx512f(auVar25,auVar86);
    dVar2 = auVar28._0_8_ + auVar28._0_8_;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = local_128.super_ChFrame<double>.coord.rot.m_data[2] * auVar23._0_8_;
    auVar23 = vaddsd_avx512f(auVar89,auVar26);
    auVar25 = vaddsd_avx512f(auVar25,auVar86);
    auVar69._8_8_ = 0;
    auVar69._0_8_ =
         local_128.super_ChFrame<double>.coord.rot.m_data[0] *
         local_128.super_ChFrame<double>.coord.rot.m_data[0];
    auVar77._8_8_ = 0;
    auVar77._0_8_ =
         local_128.super_ChFrame<double>.coord.rot.m_data[2] *
         local_128.super_ChFrame<double>.coord.rot.m_data[2];
    auVar28 = vaddsd_avx512f(auVar69,auVar77);
    auVar28 = vfmadd213sd_avx512f(auVar28,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
    auVar29 = vmulsd_avx512f(auVar17,auVar28);
    auVar73._8_8_ = 0;
    auVar73._0_8_ =
         local_128.super_ChFrame<double>.coord.rot.m_data[2] *
         local_128.super_ChFrame<double>.coord.rot.m_data[3];
    auVar30 = vsubsd_avx512f(auVar73,auVar24);
    auVar26 = vsubsd_avx512f(auVar26,auVar89);
    auVar24 = vaddsd_avx512f(auVar24,auVar73);
    auVar24 = vaddsd_avx512f(auVar24,auVar24);
    auVar31 = vmulsd_avx512f(auVar17,auVar24);
    auVar22 = vaddsd_avx512f(auVar69,auVar22);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = dVar2;
    auVar32 = vmulsd_avx512f(auVar71,auVar21);
    auVar28 = vmulsd_avx512f(auVar28,auVar21);
    auVar24 = vmulsd_avx512f(auVar24,auVar21);
    pdVar7 = (this->super_ChLoadCustomMultiple).load_Q.
             super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar14 = 3;
    if ((((ulong)pdVar7 & 7) == 0) &&
       (uVar15 = (ulong)(-((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7), uVar15 < 3)) {
      uVar14 = uVar15;
    }
    auVar95._8_8_ = 0;
    auVar95._0_8_ = dVar1;
    auVar33 = vfmadd213sd_avx512f(auVar95,auVar34,auVar35);
    auVar44._8_8_ = 0;
    auVar44._0_8_ = local_128.super_ChFrame<double>.coord.pos.m_data[0];
    auVar80._8_8_ = 0;
    auVar80._0_8_ = (double)pp_Var76 * local_128.super_ChFrame<double>.coord.pos.m_data[1];
    auVar34 = vfnmadd213sd_avx512f(auVar44,auVar19,auVar80);
    auVar48._8_8_ = 0;
    auVar48._0_8_ = auVar17._0_8_ * dVar2;
    auVar17 = vfmadd231sd_fma(auVar48,auVar27,auVar18);
    auVar87._8_8_ = 0;
    auVar87._0_8_ = auVar25._0_8_ + auVar25._0_8_;
    auVar35 = vfmadd231sd_fma(auVar29,auVar87,auVar18);
    auVar25 = vaddsd_avx512f(auVar30,auVar30);
    auVar90._8_8_ = 0;
    auVar90._0_8_ = auVar26._0_8_ + auVar26._0_8_;
    auVar18 = vfmadd231sd_fma(auVar31,auVar90,auVar18);
    auVar22 = vfmadd213sd_avx512f(auVar22,ZEXT816(0x4000000000000000),ZEXT816(0xbff0000000000000));
    auVar26 = vfnmsub231sd_avx512f(auVar32,auVar20,auVar27);
    auVar27 = vfnmsub231sd_avx512f(auVar28,auVar20,auVar87);
    auVar24 = vfnmsub231sd_avx512f(auVar24,auVar20,auVar90);
    if (uVar14 != 0) {
      uVar15 = 0;
      do {
        auVar81._0_8_ = *(ulong *)(local_448 + uVar15 * 8) ^ 0x8000000000000000;
        auVar81._8_8_ = 0x8000000000000000;
        dVar1 = (double)vmovlpd_avx(auVar81);
        pdVar7[uVar15] = dVar1;
        uVar15 = uVar15 + 1;
      } while (uVar14 != uVar15);
    }
    auVar57._8_8_ = 0;
    auVar57._0_8_ = auVar23._0_8_ + auVar23._0_8_;
    auVar17 = vfmadd231sd_fma(auVar17,auVar57,auVar34);
    auVar35 = vfmadd231sd_fma(auVar35,auVar25,auVar34);
    auVar18 = vfmadd231sd_fma(auVar18,auVar22,auVar34);
    auVar23 = vfnmadd231sd_avx512f(auVar26,auVar33,auVar57);
    auVar34 = vfnmadd231sd_avx512f(auVar27,auVar33,auVar25);
    auVar22 = vfnmadd231sd_avx512f(auVar24,auVar33,auVar22);
    if (uVar14 < 3) {
      do {
        auVar58._0_8_ = *(ulong *)(local_448 + uVar14 * 8) ^ 0x8000000000000000;
        auVar58._8_8_ = 0x8000000000000000;
        dVar1 = (double)vmovlpd_avx(auVar58);
        pdVar7[uVar14] = dVar1;
        uVar14 = uVar14 + 1;
      } while (uVar14 != 3);
    }
    local_468.m_data[0] = auVar23._0_8_ + auVar17._0_8_;
    local_468.m_data[1] = auVar35._0_8_ + auVar34._0_8_;
    local_468.m_data[2] = auVar18._0_8_ + auVar22._0_8_;
    if (5 < (this->super_ChLoadCustomMultiple).load_Q.
            super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
      pdVar8 = (this->super_ChLoadCustomMultiple).load_Q.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar7 = pdVar8 + 3;
      uVar16 = 3;
      if ((((ulong)pdVar7 & 7) == 0) &&
         (uVar11 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7, uVar11 < 3)) {
        uVar16 = uVar11;
      }
      vmovsd_avx512f(auVar33);
      vmovsd_avx512f(auVar19);
      vmovsd_avx512f(auVar20);
      vmovsd_avx512f(auVar21);
      if (uVar16 != 0) {
        memcpy(pdVar7,&local_468,(ulong)(uVar16 * 8));
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_4b8;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_470;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_4b0;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_488;
      }
      if (uVar16 < 3) {
        uVar14 = (ulong)(uVar16 << 3);
        memcpy((void *)((long)pdVar8 + uVar14 + 0x18),(void *)((long)local_468.m_data + uVar14),
               0x18 - uVar14);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_4b8;
        auVar33._8_8_ = 0;
        auVar33._0_8_ = local_470;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_4b0;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = local_488;
      }
      auVar17 = ZEXT816(0xbff0000000000000);
      auVar18 = ZEXT816(0x4000000000000000);
      if (8 < (this->super_ChLoadCustomMultiple).load_Q.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
        dVar3 = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[0] -
                local_220.super_ChFrame<double>.coord.pos.m_data[0];
        dVar4 = (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[1] -
                local_220.super_ChFrame<double>.coord.pos.m_data[1];
        auVar59._8_8_ = 0;
        auVar59._0_8_ =
             (this->frame_Bw).super_ChFrame<double>.coord.pos.m_data[2] -
             local_220.super_ChFrame<double>.coord.pos.m_data[2];
        auVar35 = vmulsd_avx512f(auVar19,auVar59);
        auVar63._8_8_ = 0;
        auVar63._0_8_ = dVar56;
        auVar53._8_8_ = 0;
        auVar53._0_8_ = dVar4;
        auVar35 = vfmsub231sd_fma(auVar35,auVar53,auVar63);
        auVar64._8_8_ = 0;
        auVar64._0_8_ = pp_Var76;
        auVar74._8_8_ = 0;
        auVar74._0_8_ = dVar56 * dVar3;
        auVar22 = vfmsub231sd_fma(auVar74,auVar64,auVar59);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = local_220.super_ChFrame<double>.coord.rot.m_data[0];
        auVar65._8_8_ = 0;
        auVar65._0_8_ = local_220.super_ChFrame<double>.coord.rot.m_data[1];
        local_220.super_ChFrame<double>.coord.rot.m_data[0] =
             local_220.super_ChFrame<double>.coord.rot.m_data[0] *
             local_220.super_ChFrame<double>.coord.rot.m_data[0];
        auVar78._8_8_ = 0;
        auVar78._0_8_ = local_220.super_ChFrame<double>.coord.rot.m_data[3];
        auVar9._8_8_ = 0x8000000000000000;
        auVar9._0_8_ = 0x8000000000000000;
        auVar23 = vxorpd_avx512vl(auVar60,auVar9);
        dVar56 = auVar23._0_8_;
        auVar23 = vmulsd_avx512f(auVar65,auVar78);
        auVar61._8_8_ = 0;
        auVar61._0_8_ =
             local_220.super_ChFrame<double>.coord.rot.m_data[0] +
             local_220.super_ChFrame<double>.coord.rot.m_data[1] *
             local_220.super_ChFrame<double>.coord.rot.m_data[1];
        auVar24 = vfmadd213sd_avx512f(auVar61,auVar18,auVar17);
        auVar66._8_8_ = 0;
        auVar66._0_8_ =
             local_220.super_ChFrame<double>.coord.rot.m_data[1] *
             local_220.super_ChFrame<double>.coord.rot.m_data[2] -
             local_220.super_ChFrame<double>.coord.rot.m_data[3] * dVar56;
        auVar34 = vaddsd_avx512f(auVar66,auVar66);
        auVar25 = vmulsd_avx512f(auVar22,auVar34);
        auVar88._8_8_ = 0;
        auVar88._0_8_ = local_220.super_ChFrame<double>.coord.rot.m_data[2] * dVar56;
        auVar26 = vaddsd_avx512f(auVar88,auVar23);
        dVar1 = local_220.super_ChFrame<double>.coord.rot.m_data[1] *
                local_220.super_ChFrame<double>.coord.rot.m_data[2] +
                local_220.super_ChFrame<double>.coord.rot.m_data[3] * dVar56;
        auVar91._8_8_ = 0;
        auVar91._0_8_ =
             local_220.super_ChFrame<double>.coord.rot.m_data[0] +
             local_220.super_ChFrame<double>.coord.rot.m_data[2] *
             local_220.super_ChFrame<double>.coord.rot.m_data[2];
        auVar27 = vfmadd213sd_avx512f(auVar91,auVar18,auVar17);
        dVar2 = local_220.super_ChFrame<double>.coord.rot.m_data[3] *
                local_220.super_ChFrame<double>.coord.rot.m_data[2] -
                local_220.super_ChFrame<double>.coord.rot.m_data[1] * dVar56;
        auVar23 = vsubsd_avx512f(auVar23,auVar88);
        dVar56 = local_220.super_ChFrame<double>.coord.rot.m_data[1] * dVar56 +
                 local_220.super_ChFrame<double>.coord.rot.m_data[3] *
                 local_220.super_ChFrame<double>.coord.rot.m_data[2];
        dVar56 = dVar56 + dVar56;
        auVar34 = vmulsd_avx512f(auVar21,auVar34);
        auVar28 = vmulsd_avx512f(auVar21,auVar27);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = dVar56;
        auVar29 = vmulsd_avx512f(auVar21,auVar79);
        pdVar8 = (this->super_ChLoadCustomMultiple).load_Q.
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
        pdVar7 = pdVar8 + 6;
        uVar16 = 3;
        if ((((ulong)pdVar7 & 7) == 0) &&
           (uVar11 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7, uVar11 < 3)) {
          uVar16 = uVar11;
        }
        auVar49._8_8_ = 0;
        auVar49._0_8_ = dVar3;
        auVar54._8_8_ = 0;
        auVar54._0_8_ = (double)pp_Var76 * dVar4;
        auVar36 = vfmsub213sd_avx512f(auVar19,auVar49,auVar54);
        auVar37 = vfmadd231sd_avx512f(auVar25,auVar24,auVar35);
        dVar3 = auVar26._0_8_ + auVar26._0_8_;
        auVar67._8_8_ = 0;
        auVar67._0_8_ = dVar1 + dVar1;
        auVar92._8_8_ = 0;
        auVar92._0_8_ = auVar22._0_8_ * auVar27._0_8_;
        auVar93 = vfmadd231sd_fma(auVar92,auVar67,auVar35);
        dVar2 = dVar2 + dVar2;
        auVar68._8_8_ = 0;
        auVar68._0_8_ = auVar23._0_8_ + auVar23._0_8_;
        auVar84._8_8_ = 0;
        auVar84._0_8_ = auVar22._0_8_ * dVar56;
        auVar85 = vfmadd231sd_fma(auVar84,auVar68,auVar35);
        auVar75._8_8_ = 0;
        auVar75._0_8_ =
             local_220.super_ChFrame<double>.coord.rot.m_data[0] +
             local_220.super_ChFrame<double>.coord.rot.m_data[3] *
             local_220.super_ChFrame<double>.coord.rot.m_data[3];
        auVar38 = vfmadd213sd_avx512f(auVar18,auVar75,auVar17);
        auVar39 = vfmadd231sd_avx512f(auVar34,auVar20,auVar24);
        auVar40 = vfmadd231sd_avx512f(auVar28,auVar20,auVar67);
        auVar41 = vfmadd231sd_avx512f(auVar29,auVar68,auVar20);
        if (uVar16 != 0) {
          vmovsd_avx512f(auVar36);
          vmovsd_avx512f(auVar38);
          vmovsd_avx512f(auVar37);
          local_350 = dVar2;
          local_348 = dVar3;
          memcpy(pdVar7,local_448,(ulong)(uVar16 * 8));
          auVar39._8_8_ = 0;
          auVar40._8_8_ = 0;
          auVar41._8_8_ = 0;
          auVar85._8_8_ = 0;
          auVar93._8_8_ = 0;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = local_4b0;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = local_340;
          auVar33._8_8_ = 0;
          auVar33._0_8_ = local_470;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = local_488;
          dVar3 = local_348;
          dVar2 = local_350;
        }
        auVar55._8_8_ = 0;
        auVar55._0_8_ = dVar2;
        auVar50._8_8_ = 0;
        auVar50._0_8_ = dVar3;
        auVar42 = vfmadd231sd_avx512f(auVar37,auVar50,auVar36);
        auVar18 = vfmadd231sd_avx512f(auVar93,auVar55,auVar36);
        auVar17 = vfmadd231sd_avx512f(auVar85,auVar38,auVar36);
        auVar43 = vfmadd231sd_avx512f(auVar39,auVar33,auVar50);
        auVar19 = vfmadd231sd_avx512f(auVar40,auVar33,auVar55);
        auVar35 = vfmadd231sd_avx512f(auVar41,auVar38,auVar33);
        if (uVar16 < 3) {
          uVar14 = (ulong)(uVar16 << 3);
          vmovsd_avx512f(auVar42);
          memcpy((void *)((long)pdVar8 + uVar14 + 0x30),local_448 + uVar14,0x18 - uVar14);
          auVar43._8_8_ = 0;
          auVar42._8_8_ = 0;
          auVar42._0_8_ = local_4b0;
        }
        auVar22 = vaddsd_avx512f(auVar42,auVar43);
        local_468.m_data[0] = auVar22._0_8_;
        local_468.m_data[1] = auVar18._0_8_ + auVar19._0_8_;
        local_468.m_data[2] = auVar17._0_8_ + auVar35._0_8_;
        if (0xb < (this->super_ChLoadCustomMultiple).load_Q.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows) {
          pdVar8 = (this->super_ChLoadCustomMultiple).load_Q.
                   super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
          pdVar7 = pdVar8 + 9;
          uVar16 = 3;
          if ((((ulong)pdVar7 & 7) == 0) &&
             (uVar11 = -((uint)((ulong)pdVar7 >> 3) & 0x1fffffff) & 7, uVar11 < 3)) {
            uVar16 = uVar11;
          }
          if (uVar16 != 0) {
            memcpy(pdVar7,&local_468,(ulong)(uVar16 * 8));
          }
          if (uVar16 < 3) {
            uVar14 = (ulong)(uVar16 << 3);
            memcpy((void *)((long)pdVar8 + uVar14 + 0x48),(void *)((long)local_468.m_data + uVar14),
                   0x18 - uVar14);
          }
          if (local_498 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498);
          }
          if (local_490 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_490);
          }
          return;
        }
      }
    }
  }
LAB_006532a1:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
               );
}

Assistant:

void ChLoadXYZROTnodeBody::ComputeQ(ChState* state_x, ChStateDelta* state_w) {
    auto mbodyA = std::dynamic_pointer_cast<ChNodeFEAxyzrot>(this->loadables[0]);
    auto mbodyB = std::dynamic_pointer_cast<ChBody>(this->loadables[1]);

    ChFrameMoving<> bodycoordA, bodycoordB;
    if (state_x) {
        // the numerical jacobian algo might change state_x
        bodycoordA.SetCoord(state_x->segment(0, 7));
        bodycoordB.SetCoord(state_x->segment(7, 7));
    } else {
        bodycoordA.SetCoord(mbodyA->coord);
        bodycoordB.SetCoord(mbodyB->coord);
    }

    if (state_w) {
        // the numerical jacobian algo might change state_w
        bodycoordA.SetPos_dt(state_w->segment(0, 3));
        bodycoordA.SetWvel_loc(state_w->segment(3, 3));
        bodycoordB.SetPos_dt(state_w->segment(6, 3));
        bodycoordB.SetWvel_loc(state_w->segment(9, 3));
    } else {
        bodycoordA.SetCoord_dt(mbodyA->GetCoord_dt());
        bodycoordB.SetCoord_dt(mbodyB->GetCoord_dt());
    }

    frame_Aw = ChFrameMoving<>(loc_application_A) >> bodycoordA;
    frame_Bw = ChFrameMoving<>(loc_application_B) >> bodycoordB;
    ChFrameMoving<> rel_AB = frame_Aw >> frame_Bw.GetInverse();

    // COMPUTE THE FORCE

    ComputeForceTorque(rel_AB, locB_force, locB_torque);

    ChVector<> abs_force = frame_Bw.TransformDirectionLocalToParent(locB_force);
    ChVector<> abs_torque = frame_Bw.TransformDirectionLocalToParent(locB_torque);

    // Compute Q

    ChVector<> loc_ftorque = bodycoordA.GetRot().RotateBack(((frame_Aw.GetPos() - bodycoordA.GetPos()) % -abs_force));
    ChVector<> loc_torque = bodycoordA.GetRot().RotateBack(-abs_torque);
    load_Q.segment(0, 3) = -abs_force.eigen();
    load_Q.segment(3, 3) = (loc_ftorque + loc_torque).eigen();

    loc_ftorque = bodycoordB.GetRot().RotateBack(((frame_Bw.GetPos() - bodycoordB.GetPos()) % abs_force));
    loc_torque = bodycoordB.GetRot().RotateBack(abs_torque);
    load_Q.segment(6, 3) = abs_force.eigen();
    load_Q.segment(9, 3) = (loc_ftorque + loc_torque).eigen();
}